

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O2

void Aig_ObjDeletePo(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  void *Entry;
  
  if ((*(uint *)&pObj->field_0x18 & 7) == 3) {
    Aig_ObjDeref((Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    pObj->pFanin0 = (Aig_Obj_t *)0x0;
    p->nObjs[*(uint *)&pObj->field_0x18 & 7] = p->nObjs[*(uint *)&pObj->field_0x18 & 7] + -1;
    Vec_PtrWriteEntry(p->vObjs,pObj->Id,Entry);
    Aig_ManRecycleMemory(p,pObj);
    return;
  }
  __assert_fail("Aig_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigObj.c"
                ,0x107,"void Aig_ObjDeletePo(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjDeletePo( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    assert( Aig_ObjIsCo(pObj) );
    Aig_ObjDeref(Aig_ObjFanin0(pObj));
    pObj->pFanin0 = NULL;
    p->nObjs[pObj->Type]--;
    Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
    Aig_ManRecycleMemory( p, pObj );
}